

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

iterator * __thiscall
NNTreeImpl::insert(iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
                  QPDFObjectHandle *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  NNTreeDetails *pNVar1;
  bool bVar2;
  int iVar3;
  pointer pTVar4;
  QPDFObjectHandle local_120;
  QPDFObjectHandle local_110;
  undefined1 local_100 [8];
  QPDFObjectHandle items;
  QPDFObjectHandle local_e0;
  undefined4 local_cc;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8 [2];
  QPDFObjectHandle local_98;
  undefined1 local_88 [8];
  iterator iter;
  QPDFObjectHandle *value_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  iter.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  QPDFObjectHandle::QPDFObjectHandle(&local_98,key);
  find((iterator *)local_88,this,&local_98,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  bVar2 = NNTreeIterator::valid((NNTreeIterator *)local_88);
  if (bVar2) {
    pNVar1 = this->details;
    QPDFObjectHandle::QPDFObjectHandle(&local_e0,key);
    pTVar4 = NNTreeIterator::operator->((NNTreeIterator *)local_88);
    this_00 = &items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this_00,&pTVar4->first);
    iVar3 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_e0,this_00);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &items.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
    if (iVar3 == 0) {
      QTC::TC("qpdf","NNTree insert replaces",0);
      (*(code *)**(undefined8 **)this->details)();
      QPDFObjectHandle::getKey
                ((QPDFObjectHandle *)local_100,
                 (string *)
                 &iter.path.
                  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                  ._M_impl._M_node._M_size);
      QPDFObjectHandle::setArrayItem
                ((QPDFObjectHandle *)local_100,
                 (int)iter.node.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
                 1,value);
      NNTreeIterator::updateIValue((NNTreeIterator *)local_88,true);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
    }
    else {
      QTC::TC("qpdf","NNTree insert inserts after",0);
      QPDFObjectHandle::QPDFObjectHandle(&local_110,key);
      QPDFObjectHandle::QPDFObjectHandle(&local_120,value);
      NNTreeIterator::insertAfter((NNTreeIterator *)local_88,&local_110,&local_120);
      QPDFObjectHandle::~QPDFObjectHandle(&local_120);
      QPDFObjectHandle::~QPDFObjectHandle(&local_110);
    }
    NNTreeIterator::NNTreeIterator(__return_storage_ptr__,(NNTreeIterator *)local_88);
  }
  else {
    QTC::TC("qpdf","NNTree insert inserts first",0);
    QPDFObjectHandle::QPDFObjectHandle(local_b8,key);
    QPDFObjectHandle::QPDFObjectHandle(&local_c8,value);
    insertFirst(__return_storage_ptr__,this,local_b8,&local_c8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
    QPDFObjectHandle::~QPDFObjectHandle(local_b8);
  }
  local_cc = 1;
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_88);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::insert(QPDFObjectHandle key, QPDFObjectHandle value)
{
    auto iter = find(key, true);
    if (!iter.valid()) {
        QTC::TC("qpdf", "NNTree insert inserts first");
        return insertFirst(key, value);
    } else if (details.compareKeys(key, iter->first) == 0) {
        QTC::TC("qpdf", "NNTree insert replaces");
        auto items = iter.node.getKey(details.itemsKey());
        items.setArrayItem(iter.item_number + 1, value);
        iter.updateIValue();
    } else {
        QTC::TC("qpdf", "NNTree insert inserts after");
        iter.insertAfter(key, value);
    }
    return iter;
}